

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetPchCreateCompileOptions
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  string *config_00;
  bool bVar5;
  long *plVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var7;
  string *psVar8;
  _Base_ptr p_Var9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  string createOptVar;
  string pchHeader;
  string pchFile;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  _Base_ptr local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string *local_48;
  string *local_40;
  string *local_38;
  
  local_40 = config;
  std::operator+(&local_88,language,config);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)(arch->_M_dataplus)._M_p);
  p_Var4 = (_Base_ptr)(local_e0 + 0x10);
  p_Var9 = (_Base_ptr)(plVar6 + 2);
  if ((_Base_ptr)*plVar6 == p_Var9) {
    local_e0._16_8_ = *(undefined8 *)p_Var9;
    local_e0._24_8_ = plVar6[3];
    local_e0._0_8_ = p_Var4;
  }
  else {
    local_e0._16_8_ = *(undefined8 *)p_Var9;
    local_e0._0_8_ = (_Base_ptr)*plVar6;
  }
  local_c0._8_8_ = plVar6[1];
  *plVar6 = (long)p_Var9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  p_Var9 = (_Base_ptr)(local_c0 + 0x10);
  if ((_Base_ptr)local_e0._0_8_ == p_Var4) {
    local_c0._24_8_ = local_e0._24_8_;
    local_c0._0_8_ = p_Var9;
  }
  else {
    local_c0._0_8_ = local_e0._0_8_;
  }
  local_c0._16_8_ = local_e0._16_8_;
  local_e0._8_8_ = 0;
  local_e0._16_8_ = local_e0._16_8_ & 0xffffffffffffff00;
  local_a0 = "";
  local_e0._0_8_ = p_Var4;
  local_48 = arch;
  local_38 = __return_storage_ptr__;
  pVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->PchCreateCompileOptions,
                      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                       *)local_c0);
  _Var7 = pVar10.first._M_node;
  if ((_Base_ptr)local_c0._0_8_ != p_Var9) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if ((_Base_ptr)local_e0._0_8_ != p_Var4) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_c0._0_8_ = p_Var9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"PCH_WARN_INVALID","");
    bVar5 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_c0);
    if ((_Base_ptr)local_c0._0_8_ != (_Base_ptr)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    local_90 = _Var7._M_node + 2;
    if (bVar5) {
      this_00 = this->Makefile;
      local_c0._24_8_ = (language->_M_dataplus)._M_p;
      local_c0._16_8_ = language->_M_string_length;
      local_c0._0_8_ = (pointer)0x6;
      local_c0._8_8_ = "CMAKE_";
      local_a0 = (char *)0x1c;
      local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x6ec2d5;
      views._M_len = 3;
      views._M_array = (iterator)local_c0;
      cmCatViews_abi_cxx11_((string *)local_e0,views);
      cmMakefile::GetSafeDefinition(this_00,(string *)local_e0);
      std::__cxx11::string::_M_assign((string *)local_90);
      if ((_Base_ptr)local_e0._0_8_ != p_Var4) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
    }
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"PCH_INSTANTIATE_TEMPLATES","");
    bVar5 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    if (bVar5) {
      local_c0._24_8_ = (language->_M_dataplus)._M_p;
      local_c0._16_8_ = language->_M_string_length;
      local_c0._0_8_ = (_Base_ptr)0x6;
      local_c0._8_8_ = "CMAKE_";
      local_a0 = (char *)0x2a;
      local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x6ec2f2;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_c0;
      cmCatViews_abi_cxx11_((string *)local_e0,views_00);
      psVar8 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_e0);
      pcVar2 = (psVar8->_M_dataplus)._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + psVar8->_M_string_length);
      if ((char *)local_88._M_string_length != (char *)0x0) {
        local_c0._8_8_ = *(undefined8 *)(_Var7._M_node + 2);
        local_c0._0_8_ = _Var7._M_node[2]._M_parent;
        local_c0._16_8_ = 1;
        local_c0._24_8_ = (long)":/\\;" + 3;
        local_a0 = (char *)local_88._M_string_length;
        local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_88._M_dataplus._M_p;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_c0;
        cmCatViews_abi_cxx11_(&local_68,views_01);
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr)local_e0._0_8_ != (_Base_ptr)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
    }
    local_c0._24_8_ = (language->_M_dataplus)._M_p;
    local_c0._16_8_ = language->_M_string_length;
    local_c0._0_8_ = (pointer)0x6;
    local_c0._8_8_ = "CMAKE_";
    local_a0 = (char *)0x1b;
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x6ec31d;
    views_02._M_len = 3;
    views_02._M_array = (iterator)local_c0;
    cmCatViews_abi_cxx11_((string *)local_e0,views_02);
    pcVar3 = *(char **)(_Var7._M_node + 2);
    p_Var4 = _Var7._M_node[2]._M_parent;
    psVar8 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_e0);
    local_c0._16_8_ = 1;
    local_c0._24_8_ = (long)":/\\;" + 3;
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(psVar8->_M_dataplus)._M_p;
    local_a0 = (char *)psVar8->_M_string_length;
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_c0;
    local_c0._0_8_ = p_Var4;
    local_c0._8_8_ = pcVar3;
    cmCatViews_abi_cxx11_(&local_88,views_03);
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    config_00 = local_40;
    psVar8 = local_48;
    GetPchHeader((string *)local_c0,this,local_40,language,local_48);
    GetPchFile(&local_88,this,config_00,language,psVar8);
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"<PCH_HEADER>","");
    cmsys::SystemTools::ReplaceString((string *)local_90,&local_68,(string *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"<PCH_FILE>","");
    cmsys::SystemTools::ReplaceString((string *)local_90,&local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr)local_c0._0_8_ != (_Base_ptr)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    if ((_Base_ptr)local_e0._0_8_ != (_Base_ptr)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
  }
  psVar8 = local_38;
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,*(long *)(_Var7._M_node + 2),
             (long)&(_Var7._M_node[2]._M_parent)->_M_color + *(long *)(_Var7._M_node + 2));
  return psVar8;
}

Assistant:

std::string cmGeneratorTarget::GetPchCreateCompileOptions(
  const std::string& config, const std::string& language,
  const std::string& arch)
{
  const auto inserted = this->PchCreateCompileOptions.insert(
    std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& createOptionList = inserted.first->second;

    if (this->GetPropertyAsBool("PCH_WARN_INVALID")) {
      createOptionList = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_INVALID_PCH"));
    }

    if (this->GetPropertyAsBool("PCH_INSTANTIATE_TEMPLATES")) {
      std::string varName = cmStrCat(
        "CMAKE_", language, "_COMPILE_OPTIONS_INSTANTIATE_TEMPLATES_PCH");
      std::string instantiateOption =
        this->Makefile->GetSafeDefinition(varName);
      if (!instantiateOption.empty()) {
        createOptionList = cmStrCat(createOptionList, ";", instantiateOption);
      }
    }

    const std::string createOptVar =
      cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_CREATE_PCH");

    createOptionList = cmStrCat(
      createOptionList, ";", this->Makefile->GetSafeDefinition(createOptVar));

    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    const std::string pchFile = this->GetPchFile(config, language, arch);

    cmSystemTools::ReplaceString(createOptionList, "<PCH_HEADER>", pchHeader);
    cmSystemTools::ReplaceString(createOptionList, "<PCH_FILE>", pchFile);
  }
  return inserted.first->second;
}